

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int armci_msg_nproc(void)

{
  int iVar1;
  MPI_Comm poVar2;
  int size;
  int local_c;
  
  iVar1 = comex_initialized();
  if (iVar1 == 0) {
    __assert_fail("comex_initialized()",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x241,"int armci_msg_nproc()");
  }
  poVar2 = wc();
  if (poVar2 != (MPI_Comm)&ompi_mpi_comm_null) {
    poVar2 = wc();
    MPI_Comm_size(poVar2,&local_c);
    return local_c;
  }
  __assert_fail("wc() != MPI_COMM_NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x242,"int armci_msg_nproc()");
}

Assistant:

int armci_msg_nproc()
{
    int size;
    assert(comex_initialized());
    assert(wc() != MPI_COMM_NULL);
    MPI_Comm_size(wc(), &size);
    return size;
}